

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O3

void __thiscall
sig::
Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
::Connection_container::Connection_container(Connection_container *this,less<int> *compare)

{
  _Rb_tree_header *p_Var1;
  
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->front).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
                       *)this,0);
  p_Var1 = &(this->grouped)._M_t._M_impl.super__Rb_tree_header;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->grouped)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->back).
  super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
  ::_M_initialize_map(&(this->back).
                       super__Deque_base<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
                      ,0);
  return;
}

Assistant:

Connection_container(const Group_compare& compare) : grouped{compare} {}